

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestMessageSize::~TestMessageSize(TestMessageSize *this)

{
  TestMessageSize *this_local;
  
  ~TestMessageSize(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TestMessageSize::~TestMessageSize() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestMessageSize)
  SharedDtor(*this);
}